

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

FOptionMenuItem * __thiscall DOptionMenu::GetItem(DOptionMenu *this,FName *name)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  FOptionMenuItem **ppFVar4;
  FName local_28;
  uint local_24;
  FName nm;
  uint i;
  FName *name_local;
  DOptionMenu *this_local;
  
  local_24 = 0;
  _nm = name;
  while( true ) {
    uVar1 = local_24;
    uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                      (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
    if (uVar3 <= uVar1) {
      return (FOptionMenuItem *)0x0;
    }
    ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                        (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                         (ulong)local_24);
    (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[7])(&local_28,*ppFVar4,0);
    bVar2 = FName::operator==(&local_28,name);
    if (bVar2) break;
    local_24 = local_24 + 1;
  }
  ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                      (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,
                       (ulong)local_24);
  return *ppFVar4;
}

Assistant:

FOptionMenuItem *DOptionMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}